

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_gstream.c
# Opt level: O0

void HTS_GStreamSet_clear(HTS_GStreamSet *gss)

{
  HTS_GStreamSet *in_RDI;
  size_t j;
  size_t i;
  ulong local_18;
  ulong local_10;
  
  if (in_RDI->gstream != (HTS_GStream *)0x0) {
    for (local_10 = 0; local_10 < in_RDI->nstream; local_10 = local_10 + 1) {
      if (in_RDI->gstream[local_10].par != (double **)0x0) {
        for (local_18 = 0; local_18 < in_RDI->total_frame; local_18 = local_18 + 1) {
          HTS_free((void *)0x218a6f);
        }
        HTS_free((void *)0x218a9b);
      }
    }
    HTS_free((void *)0x218abe);
  }
  if (in_RDI->gspeech != (double *)0x0) {
    HTS_free((void *)0x218ad8);
  }
  HTS_GStreamSet_initialize(in_RDI);
  return;
}

Assistant:

void HTS_GStreamSet_clear(HTS_GStreamSet * gss)
{
   size_t i, j;

   if (gss->gstream) {
      for (i = 0; i < gss->nstream; i++) {
         if (gss->gstream[i].par != NULL) {
            for (j = 0; j < gss->total_frame; j++)
               HTS_free(gss->gstream[i].par[j]);
            HTS_free(gss->gstream[i].par);
         }
      }
      HTS_free(gss->gstream);
   }
   if (gss->gspeech)
      HTS_free(gss->gspeech);
   HTS_GStreamSet_initialize(gss);
}